

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O0

state_status_t
tchecker::ta::initialize
          (system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
          sync_id_t *sync_id,clock_constraint_container_t *invariant,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  bool bVar1;
  integer_t iVar2;
  system_t *system_00;
  intval_t *piVar3;
  array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  flat_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables;
  mapped_type *str;
  vm_t *this_00;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *this_01;
  iterator_t puVar4;
  bytecode_t *bytecode;
  loc_id_t loc_id;
  iterator_t __end2;
  iterator_t __begin2;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *__range2;
  vm_t *vm;
  key_type local_78;
  state_status_t local_44;
  clock_constraint_container_t *pcStack_40;
  state_status_t status;
  clock_constraint_container_t *invariant_local;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  intval_sptr_t *intval_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  pcStack_40 = invariant;
  invariant_local = (clock_constraint_container_t *)sync_id;
  sync_id_local = (sync_id_t *)vedge;
  vedge_local = (vedge_sptr_t *)intval;
  intval_local = (intval_sptr_t *)vloc;
  vloc_local = (vloc_sptr_t *)system;
  system_00 = system_t::as_syncprod_system(system);
  local_44 = syncprod::initialize
                       (system_00,(vloc_sptr_t *)intval_local,(vedge_sptr_t *)sync_id_local,
                        (sync_id_t *)invariant_local,attributes);
  system_local._4_4_ = local_44;
  if (local_44 == 1) {
    piVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
              ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                           *)vedge_local)->super_intval_t;
    this = &tchecker::system::intvars_t::integer_variables((intvars_t *)(vloc_local + 0x2f))->
            super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    variables = array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::flattened(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"intval",(allocator<char> *)((long)&vm + 7));
    str = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(attributes,&local_78);
    from_string(piVar3,variables,str);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vm + 7));
    this_00 = system_t::vm((system_t *)vloc_local);
    this_01 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                           *)intval_local);
    __end2 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::begin(this_01);
    puVar4 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::end(this_01);
    for (; __end2 != puVar4; __end2 = __end2 + 1) {
      bytecode = system_t::invariant_bytecode((system_t *)vloc_local,*__end2);
      piVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                             *)vedge_local)->super_intval_t;
      iVar2 = vm_t::run(this_00,bytecode,piVar3,pcStack_40,
                        (clock_reset_container_t *)place_holder_clkreset);
      if (iVar2 == 0) {
        return 8;
      }
      bVar1 = std::vector<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>::empty
                        ((vector<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>
                          *)place_holder_clkreset);
      if (!bVar1) {
        __assert_fail("place_holder_clkreset.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0x15c,
                      "tchecker::state_status_t tchecker::ta::initialize(const tchecker::ta::system_t &, const tchecker::vloc_sptr_t &, const tchecker::intval_sptr_t &, const tchecker::vedge_sptr_t &, tchecker::sync_id_t &, tchecker::clock_constraint_container_t &, const std::map<std::string, std::string> &)"
                     );
      }
    }
    system_local._4_4_ = 1;
  }
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t initialize(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                                    tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                                    tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & invariant,
                                    std::map<std::string, std::string> const & attributes)
{
  // intialize vloc and vedge from syncprod
  auto status = tchecker::syncprod::initialize(system.as_syncprod_system(), vloc, vedge, sync_id, attributes);
  if (status != STATE_OK)
    return status;

  // initialize intval
  try {
    tchecker::from_string(*intval, system.integer_variables().flattened(), attributes.at("intval"));
  }
  catch (...) {
    return tchecker::STATE_BAD;
  }

  // check invariant
  tchecker::vm_t & vm = system.vm();
  for (tchecker::loc_id_t loc_id : *vloc) {
    if (vm.run(system.invariant_bytecode(loc_id), *intval, invariant, place_holder_clkreset) == 0)
      return tchecker::STATE_INTVARS_SRC_INVARIANT_VIOLATED;
    assert(place_holder_clkreset.empty());
  }

  return tchecker::STATE_OK;
}